

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ProgressStartEvent>::destruct
          (BasicTypeInfo<dap::ProgressStartEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ProgressStartEvent> *this_local;
  
  ProgressStartEvent::~ProgressStartEvent((ProgressStartEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }